

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

function<void_()> * __thiscall
QtPromisePrivate::PromiseHandler<void,std::function<float()>,void>::
create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
          (function<void_()> *__return_storage_ptr__,
          PromiseHandler<void,std::function<float()>,void> *this,function<float_()> *handler,
          QPromiseResolve<float> *resolve,QPromiseReject<float> *reject)

{
  anon_class_48_3_a63a5800 local_58;
  QPromiseReject<float> *local_28;
  QPromiseReject<float> *reject_local;
  QPromiseResolve<float> *resolve_local;
  function<float_()> *handler_local;
  
  local_28 = (QPromiseReject<float> *)resolve;
  reject_local = (QPromiseReject<float> *)handler;
  resolve_local = (QPromiseResolve<float> *)this;
  handler_local = (function<float_()> *)__return_storage_ptr__;
  QtPromise::QPromiseResolve<float>::QPromiseResolve
            (&local_58.resolve,(QPromiseResolve<float> *)handler);
  QtPromise::QPromiseReject<float>::QPromiseReject(&local_58.reject,local_28);
  std::function<float_()>::function(&local_58.handler,(function<float_()> *)resolve_local);
  std::function<void()>::
  function<QtPromisePrivate::PromiseHandler<void,std::function<float()>,void>::create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(std::function<float()>const&,QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)::_lambda()_1_,void>
            ((function<void()> *)__return_storage_ptr__,&local_58);
  create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(std::function<float()>const&,QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)
  ::{lambda()#1}::~create((_lambda___1_ *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void()>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=]() {
            PromiseDispatch<ResType>::call(resolve, reject, handler);
        };
    }